

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::mark_implicit_builtin
          (CompilerMSL *this,StorageClass storage,BuiltIn builtin,uint32_t id)

{
  SPIREntryPoint *pSVar1;
  TypedID<(spirv_cross::Types)2> *pTVar2;
  long lVar3;
  TypedID<(spirv_cross::Types)2> local_18;
  uint32_t local_14;
  
  lVar3 = 0xa78;
  if (storage != StorageClassInput) {
    if (storage != StorageClassOutput) {
      __assert_fail("active_builtins != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x41b,
                    "void spirv_cross::CompilerMSL::mark_implicit_builtin(StorageClass, BuiltIn, uint32_t)"
                   );
    }
    lVar3 = 0xab8;
  }
  Bitset::set((Bitset *)
              ((this->super_CompilerGLSL).super_Compiler.ir.ids.stack_storage.aligned_char +
              lVar3 + -0x40),builtin);
  pSVar1 = Compiler::get_entry_point((Compiler *)this);
  pTVar2 = (pSVar1->interface_variables).
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
  local_14 = id;
  pTVar2 = ::std::
           __find_if<spirv_cross::TypedID<(spirv_cross::Types)2>*,__gnu_cxx::__ops::_Iter_equals_val<spirv_cross::TypedID<(spirv_cross::Types)2>const>>
                     (pTVar2,pTVar2 + (pSVar1->interface_variables).
                                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>
                                      .buffer_size);
  if (pTVar2 == (pSVar1->interface_variables).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr +
                (pSVar1->interface_variables).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size) {
    _local_18 = CONCAT44(local_14,id);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::push_back
              (&pSVar1->interface_variables,&local_18);
  }
  return;
}

Assistant:

void CompilerMSL::mark_implicit_builtin(StorageClass storage, BuiltIn builtin, uint32_t id)
{
	Bitset *active_builtins = nullptr;
	switch (storage)
	{
	case StorageClassInput:
		active_builtins = &active_input_builtins;
		break;

	case StorageClassOutput:
		active_builtins = &active_output_builtins;
		break;

	default:
		break;
	}

	assert(active_builtins != nullptr);
	active_builtins->set(builtin);

	auto &var = get_entry_point().interface_variables;
	if (find(begin(var), end(var), VariableID(id)) == end(var))
		var.push_back(id);
}